

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cc
# Opt level: O2

void __thiscall flow::Program::Program(Program *this,ConstantPool *cp)

{
  ConstantPool::ConstantPool(&this->cp_,cp);
  (this->nativeFunctions_).
  super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nativeFunctions_).
  super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nativeHandlers_).
  super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nativeHandlers_).
  super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->matches_).
  super__Vector_base<std::unique_ptr<flow::Match,_std::default_delete<flow::Match>_>,_std::allocator<std::unique_ptr<flow::Match,_std::default_delete<flow::Match>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nativeHandlers_).
  super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->matches_).
  super__Vector_base<std::unique_ptr<flow::Match,_std::default_delete<flow::Match>_>,_std::allocator<std::unique_ptr<flow::Match,_std::default_delete<flow::Match>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->matches_).
  super__Vector_base<std::unique_ptr<flow::Match,_std::default_delete<flow::Match>_>,_std::allocator<std::unique_ptr<flow::Match,_std::default_delete<flow::Match>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->handlers_).
  super__Vector_base<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>,_std::allocator<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->handlers_).
  super__Vector_base<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>,_std::allocator<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->runtime_ = (Runtime *)0x0;
  (this->handlers_).
  super__Vector_base<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>,_std::allocator<std::unique_ptr<flow::Handler,_std::default_delete<flow::Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nativeFunctions_).
  super__Vector_base<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  setup(this);
  return;
}

Assistant:

Program::Program(ConstantPool&& cp)
    : cp_(std::move(cp)),
      runtime_(nullptr),
      handlers_(),
      matches_(),
      nativeHandlers_(),
      nativeFunctions_() {
  setup();
}